

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memarena.cpp
# Opt level: O0

Block * __thiscall FMemArena::AddBlock(FMemArena *this,size_t size)

{
  ulong uVar1;
  Block **local_28;
  Block **last;
  Block *mem;
  size_t size_local;
  FMemArena *this_local;
  
  uVar1 = size + 0x18;
  local_28 = &this->FreeBlocks;
  last = &this->FreeBlocks->NextBlock;
  do {
    if (last == (Block **)0x0) {
LAB_004ca77a:
      if (last == (Block **)0x0) {
        if (uVar1 < this->BlockSize) {
          mem = (Block *)this->BlockSize;
        }
        else {
          mem = (Block *)((this->BlockSize >> 1) + uVar1);
        }
        last = (Block **)
               M_Malloc_Dbg((size_t)mem,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/memarena.cpp"
                            ,0xca);
        last[1] = (Block *)((long)last + (long)mem);
      }
      Block::Reset((Block *)last);
      *last = this->TopBlock;
      this->TopBlock = (Block *)last;
      return (Block *)last;
    }
    if ((long)uVar1 <= (long)last[1] - (long)last) {
      *local_28 = *last;
      goto LAB_004ca77a;
    }
    local_28 = last;
    last = &(*last)->NextBlock;
  } while( true );
}

Assistant:

FMemArena::Block *FMemArena::AddBlock(size_t size)
{
	Block *mem, **last;
	size += sizeof(Block);		// Account for header size

	// Search for a free block to use
	for (last = &FreeBlocks, mem = FreeBlocks; mem != NULL; last = &mem->NextBlock, mem = mem->NextBlock)
	{
		if ((BYTE *)mem->Limit - (BYTE *)mem >= (ptrdiff_t)size)
		{
			*last = mem->NextBlock;
			break;
		}
	}
	if (mem == NULL)
	{
		// Allocate a new block
		if (size < BlockSize)
		{
			size = BlockSize;
		}
		else
		{ // Stick some free space at the end so we can use this block for
		  // other things.
			size += BlockSize/2;
		}
		mem = (Block *)M_Malloc(size);
		mem->Limit = (BYTE *)mem + size;
	}
	mem->Reset();
	mem->NextBlock = TopBlock;
	TopBlock = mem;
	return mem;
}